

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptree.cpp
# Opt level: O2

void __thiscall
ParseNodeSwitch::ParseNodeSwitch
          (ParseNodeSwitch *this,OpCode nop,charcount_t ichMin,charcount_t ichLim)

{
  (this->super_ParseNodeStmt).super_ParseNode.nop = nop;
  (this->super_ParseNodeStmt).super_ParseNode.grfpn = 0;
  (this->super_ParseNodeStmt).super_ParseNode.location = 0xffffffff;
  (this->super_ParseNodeStmt).super_ParseNode.field_0x1 =
       ((this->super_ParseNodeStmt).super_ParseNode.field_0x1 & 0xe0) + 1;
  (this->super_ParseNodeStmt).super_ParseNode.ichMin = ichMin;
  (this->super_ParseNodeStmt).super_ParseNode.ichLim = ichLim;
  (this->super_ParseNodeStmt).emitLabels = false;
  return;
}

Assistant:

ParseNodeSwitch::ParseNodeSwitch(OpCode nop, charcount_t ichMin, charcount_t ichLim)
    : ParseNodeStmt(nop, ichMin, ichLim)
{
}